

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_State_Test::TestBody(InterpreterTestSuite_PC_State_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  element_type *__return_storage_ptr__;
  MockSpec<ot::commissioner::State_()> *this_00;
  TypedExpectation<ot::commissioner::State_()> *pTVar3;
  char *pcVar4;
  CommissionerAppMock *this_01;
  AssertHelper local_5a8;
  Message local_5a0;
  string local_598;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_3;
  allocator local_519;
  string local_518;
  Expression local_4f8;
  AssertHelper local_4e0;
  Message local_4d8;
  string local_4d0;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_2;
  allocator local_451;
  string local_450;
  Expression local_430;
  AssertHelper local_418;
  Message local_410;
  string local_408;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_1;
  allocator local_389;
  string local_388;
  Expression local_368;
  AssertHelper local_350;
  Message local_348;
  string local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar;
  allocator local_2c1;
  string local_2c0;
  Expression local_2a0;
  undefined1 local_288 [8];
  Value value;
  Expression expr;
  Action<ot::commissioner::State_()> local_218;
  ReturnAction<ot::commissioner::State> local_1f8;
  Action<ot::commissioner::State_()> local_1e8;
  ReturnAction<ot::commissioner::State> local_1c8;
  Action<ot::commissioner::State_()> local_1b8;
  ReturnAction<ot::commissioner::State> local_198;
  Action<ot::commissioner::State_()> local_188;
  WithoutMatchers local_161;
  MockSpec<ot::commissioner::State_()> local_160 [2];
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_State_Test *this_local;
  
  this_01 = (CommissionerAppMock *)local_140;
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)this_01);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)this_01);
  __return_storage_ptr__ =
       std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&ctx.mRegistry);
  local_160[0].function_mocker_ =
       (FunctionMocker<ot::commissioner::State_()> *)
       CommissionerAppMock::gmock_GetState
                 ((MockSpec<ot::commissioner::State_()> *)__return_storage_ptr__,this_01);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<ot::commissioner::State_()>::operator()
                      (local_160,&local_161,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<ot::commissioner::State_()>::InternalExpectedAt
                     (this_00,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x3bd,"*ctx.mDefaultCommissionerObject","GetState()");
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::Times(pTVar3,4);
  testing::Return<ot::commissioner::State>((testing *)&local_198,kActive);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_188,(ReturnAction *)&local_198);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,&local_188);
  testing::Return<ot::commissioner::State>((testing *)&local_1c8,kPetitioning);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_1b8,(ReturnAction *)&local_1c8);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,&local_1b8);
  testing::Return<ot::commissioner::State>((testing *)&local_1f8,kConnected);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_1e8,(ReturnAction *)&local_1f8);
  pTVar3 = testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce
                     (pTVar3,&local_1e8);
  testing::Return<ot::commissioner::State>
            ((testing *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,kDisabled);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_218,
             (ReturnAction *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::TypedExpectation<ot::commissioner::State_()>::WillOnce(pTVar3,&local_218);
  testing::Action<ot::commissioner::State_()>::~Action(&local_218);
  testing::internal::ReturnAction<ot::commissioner::State>::~ReturnAction
            ((ReturnAction<ot::commissioner::State> *)
             &expr.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::Action<ot::commissioner::State_()>::~Action(&local_1e8);
  testing::internal::ReturnAction<ot::commissioner::State>::~ReturnAction(&local_1f8);
  testing::Action<ot::commissioner::State_()>::~Action(&local_1b8);
  testing::internal::ReturnAction<ot::commissioner::State>::~ReturnAction(&local_1c8);
  testing::Action<ot::commissioner::State_()>::~Action(&local_188);
  testing::internal::ReturnAction<ot::commissioner::State>::~ReturnAction(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"state",&local_2c1);
  ot::commissioner::Interpreter::ParseExpression(&local_2a0,(Interpreter *)local_140,&local_2c0);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=((Value *)local_288,(Value *)&gtest_ar.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar.message_);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_(&local_340,(Value *)local_288);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_320,"\"active\"","value.ToString().c_str()","active",pcVar4);
  std::__cxx11::string::~string((string *)&local_340);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_348);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3c8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"state",&local_389);
  ot::commissioner::Interpreter::ParseExpression(&local_368,(Interpreter *)local_140,&local_388);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_368);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_1.message_,(Interpreter *)local_140,pvVar1)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_288,(Value *)&gtest_ar_1.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_1.message_);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_(&local_408,(Value *)local_288);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3e8,"\"petitioning\"","value.ToString().c_str()","petitioning",pcVar4
            );
  std::__cxx11::string::~string((string *)&local_408);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar2) {
    testing::Message::Message(&local_410);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3cc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_450,"state",&local_451);
  ot::commissioner::Interpreter::ParseExpression(&local_430,(Interpreter *)local_140,&local_450);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_430);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_2.message_,(Interpreter *)local_140,pvVar1)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_288,(Value *)&gtest_ar_2.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_2.message_);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_(&local_4d0,(Value *)local_288);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4b0,"\"connected\"","value.ToString().c_str()","connected",pcVar4);
  std::__cxx11::string::~string((string *)&local_4d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar2) {
    testing::Message::Message(&local_4d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_518,"state",&local_519);
  ot::commissioner::Interpreter::ParseExpression(&local_4f8,(Interpreter *)local_140,&local_518);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_4f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_3.message_,(Interpreter *)local_140,pvVar1)
  ;
  ot::commissioner::Interpreter::Value::operator=((Value *)local_288,(Value *)&gtest_ar_3.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_3.message_);
  ot::commissioner::Interpreter::Value::ToString_abi_cxx11_(&local_598,(Value *)local_288);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_578,"\"disabled\"","value.ToString().c_str()","disabled",pcVar4);
  std::__cxx11::string::~string((string *)&local_598);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
  if (!bVar2) {
    testing::Message::Message(&local_5a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x3d4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_State)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetState())
        .Times(4)
        .WillOnce(Return(State::kActive))
        .WillOnce(Return(State::kPetitioning))
        .WillOnce(Return(State::kConnected))
        .WillOnce(Return(State::kDisabled));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("active", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("petitioning", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("connected", value.ToString().c_str());

    expr  = ctx.mInterpreter.ParseExpression("state");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_STREQ("disabled", value.ToString().c_str());
}